

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

bool pointOnEdge(QRectF *rect,QPointF *point)

{
  QPointF *in_RSI;
  QRectF *in_RDI;
  qreal qVar1;
  qreal qVar2;
  
  qVar1 = QPointF::x(in_RSI);
  qVar2 = QRectF::left(in_RDI);
  if ((qVar1 != qVar2) || (NAN(qVar1) || NAN(qVar2))) {
    qVar1 = QPointF::x(in_RSI);
    qVar2 = QRectF::right(in_RDI);
    if ((qVar1 != qVar2) || (NAN(qVar1) || NAN(qVar2))) goto LAB_005c2b2f;
  }
  qVar1 = QPointF::y(in_RSI);
  qVar2 = QRectF::top(in_RDI);
  if (qVar2 <= qVar1) {
    qVar1 = QPointF::y(in_RSI);
    qVar2 = QRectF::bottom(in_RDI);
    if (qVar1 <= qVar2) {
      return true;
    }
  }
LAB_005c2b2f:
  qVar1 = QPointF::y(in_RSI);
  qVar2 = QRectF::top(in_RDI);
  if ((qVar1 != qVar2) || (NAN(qVar1) || NAN(qVar2))) {
    qVar1 = QPointF::y(in_RSI);
    qVar2 = QRectF::bottom(in_RDI);
    if (qVar1 != qVar2) {
      return false;
    }
    if (NAN(qVar1) || NAN(qVar2)) {
      return false;
    }
  }
  qVar1 = QPointF::x(in_RSI);
  qVar2 = QRectF::left(in_RDI);
  if (qVar2 <= qVar1) {
    qVar1 = QPointF::x(in_RSI);
    qVar2 = QRectF::right(in_RDI);
    if (qVar1 <= qVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool pointOnEdge(const QRectF &rect, const QPointF &point)
{
    if ((point.x() == rect.left() || point.x() == rect.right()) &&
        (point.y() >= rect.top() && point.y() <= rect.bottom()))
        return true;
    if ((point.y() == rect.top() || point.y() == rect.bottom()) &&
        (point.x() >= rect.left() && point.x() <= rect.right()))
        return true;
    return false;
}